

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

double BinaryenConstGetValueF64(BinaryenExpressionRef expr)

{
  if (expr->_id != ConstId) {
    __assert_fail("expression->is<Const>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0xb08,"double BinaryenConstGetValueF64(BinaryenExpressionRef)");
  }
  if (*(long *)(expr + 2) == 5) {
    return *(double *)(expr + 1);
  }
  __assert_fail("type == Type::f64",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                ,0x129,"double wasm::Literal::getf64() const");
}

Assistant:

double BinaryenConstGetValueF64(BinaryenExpressionRef expr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Const>());
  return static_cast<Const*>(expression)->value.getf64();
}